

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::CompactData::CompactDataSink::put
          (CompactDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  byte bVar1;
  CompactData *pCVar2;
  UBool UVar3;
  char cVar4;
  int32_t iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  long lVar9;
  int i;
  char16_t *s1;
  int32_t patternLength;
  ResourceTable powersOfTenTable;
  ResourceTable pluralVariantsTable;
  uint local_bc;
  char *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  CompactDataSink *local_a0;
  undefined8 local_98;
  ulong local_90;
  long local_88;
  ResourceTable local_80;
  ResourceTable local_58;
  
  local_b8 = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_80,value,status,CONCAT71(in_register_00000009,param_3));
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar6 = 0;
    UVar3 = ResourceTable::getKeyAndValue(&local_80,0,&local_b8,value);
    if (UVar3 != '\0') {
      local_a0 = this;
      do {
        sVar8 = strlen(local_b8);
        cVar4 = (char)sVar8 + -1;
        local_98 = CONCAT71((int7)(sVar8 >> 8),cVar4);
        local_88 = (long)cVar4;
        bVar1 = this->data->multipliers[local_88];
        local_bc = (uint)bVar1;
        (*(value->super_UObject)._vptr_UObject[0xb])(&local_58,value,status);
        iVar7 = 1;
        if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
          UVar3 = ResourceTable::getKeyAndValue(&local_58,0,&local_b8,value);
          iVar7 = 5;
          if (UVar3 != '\0') {
            local_a4 = (char)local_98 * 6;
            local_90 = (ulong)(uint)~(int)(char)local_98;
            i = 0;
            local_ac = iVar6;
            do {
              iVar5 = StandardPlural::indexFromString(local_b8,status);
              iVar7 = 1;
              if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                iVar6 = iVar5 + local_a4;
                iVar7 = 7;
                if (this->data->patterns[iVar6] == (UChar *)0x0) {
                  iVar7 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_a8,status);
                  s1 = (char16_t *)CONCAT44(extraout_var,iVar7);
                  iVar7 = 1;
                  this = local_a0;
                  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
                    iVar5 = u_strcmp_63(s1,L"0");
                    if (iVar5 == 0) {
                      local_a8 = 0;
                      s1 = L"<USE FALLBACK>";
                    }
                    local_a0->data->patterns[iVar6] = s1;
                    iVar7 = 0;
                    this = local_a0;
                    if ((byte)local_bc == '\0') {
                      iVar7 = 0;
                      iVar6 = 0;
                      if (0 < (long)local_a8) {
                        lVar9 = 0;
                        iVar6 = 0;
                        do {
                          if (s1[lVar9] == L'0') {
                            iVar6 = iVar6 + 1;
                          }
                          else if (0 < iVar6) break;
                          lVar9 = lVar9 + 1;
                        } while (local_a8 != lVar9);
                      }
                      local_bc = local_bc & 0xff;
                      if (0 < iVar6) {
                        local_bc = (int)local_90 + iVar6;
                      }
                    }
                  }
                }
              }
              bVar1 = (byte)local_bc;
              if ((iVar7 != 7) && (iVar6 = local_ac, iVar7 != 0)) goto LAB_0027f1e7;
              i = i + 1;
              UVar3 = ResourceTable::getKeyAndValue(&local_58,i,&local_b8,value);
            } while (UVar3 != '\0');
            iVar7 = 5;
            iVar6 = local_ac;
          }
LAB_0027f1e7:
          local_bc._0_1_ = bVar1;
          if (iVar7 == 5) {
            iVar7 = 0;
            if (this->data->multipliers[local_88] == '\0') {
              this->data->multipliers[local_88] = (byte)local_bc;
              pCVar2 = this->data;
              if (pCVar2->largestMagnitude < (char)local_98) {
                pCVar2->largestMagnitude = (char)local_98;
              }
              pCVar2->isEmpty = '\0';
            }
          }
        }
        if (iVar7 != 0) {
          return;
        }
        iVar6 = iVar6 + 1;
        UVar3 = ResourceTable::getKeyAndValue(&local_80,iVar6,&local_b8,value);
      } while (UVar3 != '\0');
    }
  }
  return;
}

Assistant:

void CompactData::CompactDataSink::put(const char *key, ResourceValue &value, UBool /*noFallback*/,
                                       UErrorCode &status) {
    // traverse into the table of powers of ten
    ResourceTable powersOfTenTable = value.getTable(status);
    if (U_FAILURE(status)) { return; }
    for (int i3 = 0; powersOfTenTable.getKeyAndValue(i3, key, value); ++i3) {

        // Assumes that the keys are always of the form "10000" where the magnitude is the
        // length of the key minus one.  We expect magnitudes to be less than MAX_DIGITS.
        auto magnitude = static_cast<int8_t> (strlen(key) - 1);
        int8_t multiplier = data.multipliers[magnitude];
        U_ASSERT(magnitude < COMPACT_MAX_DIGITS);

        // Iterate over the plural variants ("one", "other", etc)
        ResourceTable pluralVariantsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i4 = 0; pluralVariantsTable.getKeyAndValue(i4, key, value); ++i4) {

            // Skip this magnitude/plural if we already have it from a child locale.
            // Note: This also skips USE_FALLBACK entries.
            StandardPlural::Form plural = StandardPlural::fromString(key, status);
            if (U_FAILURE(status)) { return; }
            if (data.patterns[getIndex(magnitude, plural)] != nullptr) {
                continue;
            }

            // The value "0" means that we need to use the default pattern and not fall back
            // to parent locales. Example locale where this is relevant: 'it'.
            int32_t patternLength;
            const UChar *patternString = value.getString(patternLength, status);
            if (U_FAILURE(status)) { return; }
            if (u_strcmp(patternString, u"0") == 0) {
                patternString = USE_FALLBACK;
                patternLength = 0;
            }

            // Save the pattern string. We will parse it lazily.
            data.patterns[getIndex(magnitude, plural)] = patternString;

            // If necessary, compute the multiplier: the difference between the magnitude
            // and the number of zeros in the pattern.
            if (multiplier == 0) {
                int32_t numZeros = countZeros(patternString, patternLength);
                if (numZeros > 0) { // numZeros==0 in certain cases, like Somali "Kun"
                    multiplier = static_cast<int8_t> (numZeros - magnitude - 1);
                }
            }
        }

        // Save the multiplier.
        if (data.multipliers[magnitude] == 0) {
            data.multipliers[magnitude] = multiplier;
            if (magnitude > data.largestMagnitude) {
                data.largestMagnitude = magnitude;
            }
            data.isEmpty = false;
        } else {
            U_ASSERT(data.multipliers[magnitude] == multiplier);
        }
    }
}